

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

_Bool IsTextureValid(Texture2D texture)

{
  return 0 < texture.mipmaps &&
         ((0 < texture.format && texture.id != 0) && (0 < texture.height && 0 < texture.width));
}

Assistant:

bool IsTextureValid(Texture2D texture)
{
    bool result = false;

    // TODO: Validate maximum texture size supported by GPU

    if ((texture.id > 0) &&         // Validate OpenGL id (texture uplaoded to GPU)
        (texture.width > 0) &&      // Validate texture width
        (texture.height > 0) &&     // Validate texture height
        (texture.format > 0) &&     // Validate texture pixel format
        (texture.mipmaps > 0)) result = true;     // Validate texture mipmaps (at least 1 for basic mipmap level)

    return result;
}